

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O2

int gen_builder_struct_field_assign
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int conversion,
              int from_ptr)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  fb_output_t *pfVar7;
  uint uVar8;
  char *__format;
  char *pcVar9;
  char *pcVar10;
  FILE *pFVar11;
  fb_symbol_t *pfVar12;
  int iVar13;
  ulong uVar14;
  size_t sVar15;
  fb_scoped_name_t snref;
  
  memset(&snref,0,0xe8);
  pcVar5 = "";
  if (arg_count == 1) {
    pcVar5 = "_from_pe";
  }
  pcVar4 = "_to_pe";
  if (arg_count != 2) {
    pcVar4 = pcVar5;
  }
  pfVar12 = (fb_symbol_t *)&ct->members;
  uVar14 = 0;
  uVar8 = 0;
  pcVar5 = pcVar4;
LAB_0010c9d1:
  do {
    while( true ) {
      iVar13 = (int)pcVar5;
      pfVar12 = pfVar12->link;
      if (pfVar12 == (fb_symbol_t *)0x0) {
        if (0 < index) {
          sVar15 = fwrite(";\n  ",4,1,(FILE *)out->fp);
          iVar13 = (int)sVar15;
        }
        return iVar13;
      }
      uVar6 = (ulong)(uint)pfVar12->ident->len;
      pcVar5 = pfVar12->ident->text;
      iVar13 = (int)uVar14;
      if (0 < iVar13) {
        if ((uVar14 & 3) == 0) {
          pcVar10 = ";\n  ";
          sVar15 = 4;
        }
        else {
          pcVar10 = "; ";
          sVar15 = 2;
        }
        fwrite(pcVar10,sVar15,1,(FILE *)out->fp);
      }
      uVar1 = pfVar12[1].kind;
      if (uVar1 != 9) break;
      pcVar10 = scalar_type_prefix(*(fb_scalar_type_t *)&pfVar12[1].link);
      if ((pfVar12[4].kind & 4) == 0) {
        iVar3 = arg_count;
        if (pfVar12[5].ident == (fb_token_t *)&DAT_00000001) {
          iVar3 = 0;
        }
        pFVar11 = (FILE *)out->fp;
        pfVar7 = out;
        if (iVar3 == 2) {
          if (conversion == 0) {
            pcVar9 = "%s%s_assign_to_pe(&p->%.*s, v%i)";
          }
          else {
            pcVar9 = "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)";
            uVar14 = uVar6;
          }
        }
        else {
          if (iVar3 != 1) {
LAB_0010cc7a:
            if (conversion == 0) {
              uVar2 = fprintf(pFVar11,"p->%.*s = v%i",uVar6,pcVar5,uVar14);
              pcVar5 = (char *)(ulong)uVar2;
            }
            else {
              uVar2 = fprintf(pFVar11,"p->%.*s = p2->%.*s",uVar6,pcVar5,uVar6,pcVar5);
              pcVar5 = (char *)(ulong)uVar2;
            }
            goto LAB_0010ce18;
          }
          if (conversion == 0) {
            pcVar9 = "%s%s_assign_from_pe(&p->%.*s, v%i)";
          }
          else {
            pcVar9 = "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)";
            uVar14 = uVar6;
          }
        }
LAB_0010ce11:
        uVar2 = fprintf(pFVar11,pcVar9,pfVar7,pcVar10,uVar6,pcVar5,uVar14);
LAB_0010ce16:
        pcVar5 = (char *)(ulong)uVar2;
      }
      else {
LAB_0010cc37:
        pFVar11 = (FILE *)out->fp;
LAB_0010cc3e:
        uVar2 = fprintf(pFVar11,"__%sstruct_clear_field(p->__deprecated%i)",out,(ulong)uVar8);
        pcVar5 = (char *)(ulong)uVar2;
        uVar8 = uVar8 + 1;
      }
LAB_0010ce18:
      uVar14 = (ulong)(iVar13 + 1);
    }
    if (uVar1 == 0xf) {
      fb_compound_name((fb_compound_type_t *)pfVar12[1].link,&snref);
      if ((pfVar12[1].link)->kind != 1) {
        if ((pfVar12[4].kind & 4) != 0) goto LAB_0010cc37;
        iVar3 = arg_count;
        if (pfVar12[5].ident == (fb_token_t *)&DAT_00000001) {
          iVar3 = 0;
        }
        pFVar11 = (FILE *)out->fp;
        if (iVar3 == 2) {
          if (conversion == 0) {
            pcVar10 = "%s%s_assign_to_pe(&p->%.*s, v%i)";
LAB_0010ce30:
            uVar2 = fprintf(pFVar11,pcVar10 + 2,&snref,uVar6,pcVar5,uVar14);
            pcVar5 = (char *)(ulong)uVar2;
            goto LAB_0010ce18;
          }
          pcVar10 = "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)";
        }
        else {
          if (iVar3 != 1) goto LAB_0010cc7a;
          if (conversion == 0) {
            pcVar10 = "%s%s_assign_from_pe(&p->%.*s, v%i)";
            goto LAB_0010ce30;
          }
          pcVar10 = "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)";
        }
        uVar2 = fprintf(pFVar11,pcVar10 + 2,&snref,uVar6,pcVar5,uVar6,pcVar5);
        goto LAB_0010ce16;
      }
      pFVar11 = (FILE *)out->fp;
      if ((pfVar12[4].kind & 4) == 0) {
        if (conversion != 0) {
          pcVar9 = "%s_copy%s(&p->%.*s, &p2->%.*s)";
          pcVar10 = pcVar4;
          pfVar7 = (fb_output_t *)&snref;
          uVar14 = uVar6;
          goto LAB_0010ce11;
        }
        fprintf(pFVar11,"%s_assign%s(&p->%.*s",&snref,pcVar4,uVar6,pcVar5);
        uVar2 = gen_builder_struct_call_list
                          (out,(fb_compound_type_t *)pfVar12[1].link,iVar13,index,0);
        uVar14 = (ulong)uVar2;
        uVar2 = fputc(0x29,(FILE *)out->fp);
        pcVar5 = (char *)(ulong)uVar2;
      }
      else {
        fprintf(pFVar11,"__%sstruct_clear_field(p->__deprecated%i)",out,(ulong)uVar8);
        uVar8 = uVar8 + 1;
        iVar3 = get_total_struct_field_count((fb_compound_type_t *)pfVar12[1].link);
        pcVar5 = (char *)(ulong)(uint)(iVar3 + iVar13);
        uVar14 = (ulong)(uint)(iVar3 + iVar13);
      }
      goto LAB_0010c9d1;
    }
    if (uVar1 == 0x11) {
      pcVar10 = scalar_type_prefix(*(fb_scalar_type_t *)&pfVar12[1].link);
      pFVar11 = (FILE *)out->fp;
      if ((pfVar12[4].kind & 4) == 0) {
        pcVar9 = (char *)(ulong)*(uint *)&pfVar12[1].field_0x14;
        if (conversion == 0) {
          __format = "%s%s_array_copy%s(p->%.*s, v%i, %d)";
        }
        else {
          __format = "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)";
          uVar14 = uVar6;
          pcVar9 = pcVar5;
        }
        uVar2 = fprintf(pFVar11,__format,out,pcVar10,pcVar4,uVar6,pcVar5,uVar14,pcVar9);
        pcVar5 = (char *)(ulong)uVar2;
        goto LAB_0010ce18;
      }
      goto LAB_0010cc3e;
    }
    if (uVar1 != 0x14) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
              ,0x4ad,"internal error: type error");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                    ,0x4ad,
                    "int gen_builder_struct_field_assign(fb_output_t *, fb_compound_type_t *, int, int, int, int)"
                   );
    }
    uVar2 = *(uint *)&pfVar12[1].field_0x14;
    fb_compound_name((fb_compound_type_t *)pfVar12[1].link,&snref);
    pFVar11 = (FILE *)out->fp;
    if ((pfVar12[4].kind & 4) == 0) {
      if (conversion == 0) {
        fprintf(pFVar11,"%s_array_copy%s(p->%.*s, v%i, %d)",&snref,pcVar4,uVar6,pcVar5,uVar14,
                (ulong)uVar2);
      }
      else {
        fprintf(pFVar11,"%s_array_copy%s(p->%.*s, p2->%.*s, %d)",&snref,pcVar4,uVar6,pcVar5,uVar6,
                pcVar5,(ulong)uVar2);
      }
      uVar14 = (ulong)(iVar13 + 1);
      pcVar5 = &DAT_00000001;
    }
    else {
      uVar2 = fprintf(pFVar11,"__%sstruct_clear_field(p->__deprecated%i)",out,(ulong)uVar8);
      pcVar5 = (char *)(ulong)uVar2;
      uVar8 = uVar8 + 1;
      uVar14 = (ulong)(iVar13 + 1);
    }
  } while( true );
}

Assistant:

static int gen_builder_struct_field_assign(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count,
        int conversion, int from_ptr)
{
    const char *nsc = out->nsc;
    fb_member_t *member;
    fb_symbol_t *sym;
    int n, len;
    const char *s;
    int deprecated_index = 0;
    const char *kind, *tprefix;
    fb_scoped_name_t snref;

    fb_clear(snref);
    switch (conversion) {
    case convert_to_pe: kind = "_to_pe"; break;
    case convert_from_pe: kind = "_from_pe"; break;
    default: kind = ""; break;
    }
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &n, &s);

        if (index > 0) {
            if (index % 4 == 0) {
                fprintf(out->fp, ";\n  ");
            } else {
                fprintf(out->fp, "; ");
            }
        }
        switch (member->type.type) {
        case vt_fixed_array_compound_type_ref:
            len = (int)member->type.len;
            fb_compound_name(member->type.ct, &snref);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        snref.text, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, v%i, %d)",
                        snref.text, kind, n, s, index, len);
            }
            ++index;
            continue;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snref);
            if (member->type.ct->symbol.kind == fb_is_struct) {
                if (member->metadata_flags & fb_f_deprecated) {
                    fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                            nsc, deprecated_index);
                    deprecated_index++;
                    index += get_total_struct_field_count(member->type.ct);
                    continue;
                }
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy%s(&p->%.*s, &p2->%.*s)", snref.text, kind, n, s, n, s);
                    /* `index` does not count children, but it doesn't matter here. */
                    ++index;
                } else {
                    fprintf(out->fp, "%s_assign%s(&p->%.*s", snref.text, kind, n, s);
                    index = gen_builder_struct_call_list(out, member->type.ct, index, arg_count, 0);
                    fprintf(out->fp, ")");
                }
                continue;
            }
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_from_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_to_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            continue;
        case vt_fixed_array_type:
            tprefix = scalar_type_prefix(member->type.st);
            len = (int)member->type.len;
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        nsc, tprefix, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, v%i, %d)",
                        nsc, tprefix, kind, n, s, index, len);
            }
            ++index;
            break;
        case vt_scalar_type:
            tprefix = scalar_type_prefix(member->type.st);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_from_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_to_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            break;
        default:
            gen_panic(out, "internal error: type error");
            continue;
        }
    }
    if (arg_count > 0) {
        fprintf(out->fp, ";\n  ");
    }
    return index;
}